

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char cVar4;
  bool bVar5;
  uint32_t uVar6;
  ExecutionModel EVar7;
  SPIREntryPoint *pSVar8;
  size_type sVar9;
  undefined8 *puVar10;
  CompilerError *this_00;
  long *plVar11;
  SPIRType *pSVar12;
  ulong uVar13;
  runtime_error *this_01;
  ulong *puVar14;
  size_type *psVar15;
  uint32_t uVar16;
  char *pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  char (*in_R8) [4];
  BuiltIn builtin;
  string loc_qual;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar21;
  char cVar22;
  byte bVar23;
  BuiltIn builtin_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  SPIRType *local_58;
  string local_50;
  
  pSVar8 = Compiler::get_entry_point((Compiler *)this);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id
                       );
  builtin_00 = BuiltInMax;
  bVar5 = Compiler::is_member_builtin
                    ((Compiler *)this,type,index,(BuiltIn *)&stack0xffffffffffffff3c);
  uVar21 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffff38);
  bVar5 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationResourceIndexPrimary);
  if (bVar5) {
    uVar6 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    local_b8._M_dataplus._M_p._0_4_ = uVar6;
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" [[id(",(char (*) [7])&local_b8,
               (uint *)0x415df5,(char (*) [2])in_R8);
    local_b8._M_dataplus._M_p._0_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationInterfaceOrigID);
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                    (key_type_conflict *)&local_b8);
    if (sVar9 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if ((pSVar8->model == ExecutionModelVertex) && (type->storage == Input)) {
    if ((char)((uint)uVar21 >> 0x18) != '\0') {
      if (((0x2b < (ulong)builtin_00) || ((0xc0000000060U >> ((ulong)builtin_00 & 0x3f) & 1) == 0))
         && (1 < builtin_00 - BaseVertex)) {
        if (builtin_00 == BuiltInDrawIndex) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"DrawIndex is not supported in MSL.");
          goto LAB_002b4e1a;
        }
        goto LAB_002b4166;
      }
      if ((this->msl_options).vertex_for_tessellation == true) goto LAB_002b4166;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
      uVar13 = CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length) +
               local_98._M_string_length;
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar19 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < uVar13) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar19 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < uVar13) goto LAB_002b393a;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
      }
      else {
LAB_002b393a:
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_b8.field_2._M_allocated_capacity = *puVar14;
        local_b8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *puVar14;
        local_b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_b8._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)puVar14 = 0;
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar15) {
        lVar2 = plVar11[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar11;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
      }
      __return_storage_ptr__->_M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      goto LAB_002b3dab;
    }
    uVar6 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
    if (uVar6 == 0xffffffff) goto LAB_002b39ea;
    paVar18 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar18;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[attribute(","");
    cVar22 = '\x01';
    if (9 < uVar6) {
      uVar16 = uVar6;
      cVar4 = '\x04';
      do {
        cVar22 = cVar4;
        if (uVar16 < 100) {
          cVar22 = cVar22 + -2;
          goto LAB_002b3f28;
        }
        if (uVar16 < 1000) {
          cVar22 = cVar22 + -1;
          goto LAB_002b3f28;
        }
        if (uVar16 < 10000) goto LAB_002b3f28;
        bVar5 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar4 = cVar22 + '\x04';
      } while (bVar5);
      cVar22 = cVar22 + '\x01';
    }
LAB_002b3f28:
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct((ulong)&local_78,cVar22);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar6);
    uVar13 = CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length) +
             local_98._M_string_length;
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar18) {
      uVar19 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < uVar13) {
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        uVar19 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < uVar13) goto LAB_002b3f8d;
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
    }
    else {
LAB_002b3f8d:
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b8._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar11 = (long *)::std::__cxx11::string::append((char *)&local_b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar15 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar15) {
      lVar2 = plVar11[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar11;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
    }
    __return_storage_ptr__->_M_string_length = plVar11[1];
    *plVar11 = (long)psVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    _Var20._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var20._M_p = local_98._M_dataplus._M_p;
    }
LAB_002b406c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p == paVar18) {
      return __return_storage_ptr__;
    }
    goto LAB_002b43c9;
  }
LAB_002b39ea:
  if ((((pSVar8->model != ExecutionModelVertex) ||
       ((this->msl_options).vertex_for_tessellation == true)) &&
      (EVar7 = Compiler::get_execution_model((Compiler *)this),
      EVar7 != ExecutionModelTessellationEvaluation)) || (type->storage != Output)) {
LAB_002b3b21:
    if (((pSVar8->model == ExecutionModelVertex) &&
        ((this->msl_options).vertex_for_tessellation == true)) && (type->storage == Output)) {
LAB_002b4144:
      if ((char)((uint)uVar21 >> 0x18) != '\0') {
        get_or_allocate_builtin_output_member_location
                  (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
switchD_002b3a45_caseD_2:
LAB_002b4166:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar7 == ExecutionModelTessellationControl) && (type->storage == Input)) {
      cVar22 = (char)((uint)uVar21 >> 0x18);
      if (cVar22 == '\0') {
LAB_002b4083:
        if ((this->msl_options).multi_patch_workgroup != true) {
          if (cVar22 == '\0') {
            local_50._M_dataplus._M_p._0_4_ =
                 get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          }
          else {
            in_R8 = (char (*) [4])0x0;
            local_50._M_dataplus._M_p._0_4_ =
                 get_or_allocate_builtin_input_member_location
                           (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          }
          if ((uint32_t)local_50._M_dataplus._M_p != 0xffffffff) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98," [[attribute(","");
            convert_to_string<unsigned_int,_0>(&local_78,(uint *)&local_50);
            ::std::operator+(&local_b8,&local_98,&local_78);
            ::std::operator+(__return_storage_ptr__,&local_b8,")]]");
            goto LAB_002b3dab;
          }
          goto LAB_002b412c;
        }
      }
      else {
        if (0x23 < (int)builtin_00) {
          if ((builtin_00 == BuiltInSubgroupSize) ||
             (builtin_00 == BuiltInSubgroupLocalInvocationId)) {
            if ((this->msl_options).emulate_subgroups == true) goto switchD_002b3a45_caseD_2;
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
            builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
            ::std::operator+(&local_98,&local_78,&local_50);
            puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_b8.field_2._M_allocated_capacity = *puVar14;
              local_b8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_b8.field_2._M_allocated_capacity = *puVar14;
              local_b8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_b8._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            pcVar17 = " ";
            if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              pcVar17 = "";
            }
            ::std::operator+(__return_storage_ptr__,&local_b8,pcVar17);
            goto LAB_002b4387;
          }
          goto LAB_002b4083;
        }
        if (builtin_00 - BuiltInPrimitiveId < 2) {
          if ((this->msl_options).multi_patch_workgroup != true) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
            builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
            ::std::operator+(&local_98,&local_78,&local_50);
            puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_b8.field_2._M_allocated_capacity = *puVar14;
              local_b8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_b8.field_2._M_allocated_capacity = *puVar14;
              local_b8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_b8._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            pcVar17 = " ";
            if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              pcVar17 = "";
            }
            ::std::operator+(__return_storage_ptr__,&local_b8,pcVar17);
            goto LAB_002b4387;
          }
        }
        else if (builtin_00 != BuiltInPatchVertices) goto LAB_002b4083;
      }
      goto switchD_002b3a45_caseD_2;
    }
LAB_002b412c:
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar7 == ExecutionModelTessellationControl) && (type->storage == Output))
    goto LAB_002b4144;
    EVar7 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar7 != ExecutionModelTessellationEvaluation) || (type->storage != Input)) {
LAB_002b46e7:
      if ((pSVar8->model != ExecutionModelFragment) || (type->storage != Input)) {
LAB_002b4a07:
        bVar23 = (byte)((uint)uVar21 >> 0x18);
        if (type->storage == Output && pSVar8->model == ExecutionModelFragment) {
          if (bVar23 == 0) {
            uVar6 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
            local_b8._M_dataplus._M_p._0_4_ = uVar6;
            if (uVar6 != 0xffffffff) {
              if (((this->msl_options).enable_frag_output_mask >> (uVar6 & 0x1f) & 1) == 0) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,"");
                return __return_storage_ptr__;
              }
              if ((uVar6 != 0xffffffff) &&
                 (bVar5 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationIndex), bVar5)) {
                local_98._M_dataplus._M_p._0_4_ =
                     Compiler::get_member_decoration
                               ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                DecorationIndex);
                join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
                          (__return_storage_ptr__,(spirv_cross *)" [[color(",
                           (char (*) [10])&local_b8,(uint *)"), index(",(char (*) [10])&local_98,
                           (uint *)")]]",(char (*) [4])CONCAT44(builtin_00,uVar21));
                return __return_storage_ptr__;
              }
            }
            if ((uint32_t)local_b8._M_dataplus._M_p != -1) {
              join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                        (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&local_b8,
                         (uint *)")]]",in_R8);
              return __return_storage_ptr__;
            }
            bVar5 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationIndex);
            if (bVar5) {
              local_98._M_dataplus._M_p._0_4_ =
                   Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                              DecorationIndex);
              join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                        (__return_storage_ptr__,(spirv_cross *)" [[index(",(char (*) [10])&local_98,
                         (uint *)")]]",in_R8);
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
            return __return_storage_ptr__;
          }
          if (builtin_00 != BuiltInSampleMask) {
            if (builtin_00 != BuiltInFragDepth) {
              if ((builtin_00 != BuiltInFragStencilRefEXT) ||
                 ((this->msl_options).enable_frag_stencil_ref_builtin == false)) goto LAB_002b4166;
              if ((this->msl_options).msl_version < 0x4e84) {
                this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (this_00,"Stencil export only supported in MSL 2.1 and up.");
LAB_002b4e1a:
                __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
              builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
              ::std::operator+(&local_b8,&local_98,&local_78);
              ::std::operator+(__return_storage_ptr__,&local_b8,"]]");
              goto LAB_002b3dab;
            }
            if ((this->msl_options).enable_frag_depth_builtin == false) goto LAB_002b4166;
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
          ::std::operator+(&local_b8,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&local_b8,"]]");
        }
        else {
          if ((((bVar23 & (type->storage == Input && pSVar8->model == ExecutionModelGLCompute)) != 1
               ) || (uVar13 = (ulong)builtin_00, 0x29 < uVar13)) ||
             (((0x3d000000UL >> (uVar13 & 0x3f) & 1) == 0 &&
              (((0x35000000000U >> (uVar13 & 0x3f) & 1) == 0 ||
               ((this->msl_options).emulate_subgroups != false)))))) goto LAB_002b4166;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
          ::std::operator+(&local_b8,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&local_b8,"]]");
        }
        goto LAB_002b3dab;
      }
      paVar18 = &local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity =
           local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_b8._M_dataplus._M_p = (pointer)paVar18;
      if ((char)((uint)uVar21 >> 0x18) == '\0') {
        member_location_attribute_qualifier_abi_cxx11_(&local_98,this,type,index);
LAB_002b47ac:
        ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
LAB_002b47d0:
        if (((builtin_00 & ~BuiltInPointSize) == BaryCoordKHR) &&
           (((bVar5 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationFlat), bVar5 ||
             (bVar5 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 Centroid), bVar5)) ||
            ((bVar5 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationSample), bVar5 ||
             (bVar5 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationNoPerspective), bVar5)))))) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this_01,
                     "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs."
                    );
          *(undefined ***)this_01 = &PTR__runtime_error_0050aef0;
          __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((7 < local_58->basetype - SByte) &&
           (((byte)((uint)uVar21 >> 0x18) & builtin_00 == BuiltInFragCoord) == 0)) {
          bVar5 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationFlat);
          if (bVar5) {
            if (local_b8._M_string_length != 0) {
              ::std::__cxx11::string::append((char *)&local_b8);
            }
          }
          else {
            bVar5 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               Centroid);
            if (bVar5) {
              if (local_b8._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationNoPerspective);
            }
            else {
              bVar5 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationSample);
              if (bVar5) {
                if (local_b8._M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)&local_b8);
                }
                Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationNoPerspective);
              }
              else {
                bVar5 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                   DecorationNoPerspective);
                if (!bVar5) goto LAB_002b49a4;
                if (local_b8._M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)&local_b8);
                }
              }
            }
          }
          ::std::__cxx11::string::append((char *)&local_b8);
        }
LAB_002b49a4:
        if (local_b8._M_string_length == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar18) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          goto LAB_002b4a07;
        }
        ::std::operator+(&local_98," [[",&local_b8);
        ::std::operator+(__return_storage_ptr__,&local_98,"]]");
        _Var20._M_p = local_b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
          _Var20._M_p = local_b8._M_dataplus._M_p;
        }
      }
      else {
        if (BuiltInSampleMask < builtin_00) {
LAB_002b4790:
          if ((builtin_00 - BaryCoordKHR < 2) ||
             (((builtin_00 == BuiltInViewIndex && ((this->msl_options).multiview == true)) &&
              ((this->msl_options).multiview_layered_rendering == true)))) {
LAB_002b479f:
            builtin_qualifier_abi_cxx11_(&local_98,this,builtin_00);
            goto LAB_002b47ac;
          }
          goto LAB_002b47d0;
        }
        if ((0x178200U >> (builtin_00 & BuiltInGlobalSize) & 1) != 0) goto LAB_002b479f;
        if (builtin_00 == BuiltInClipDistance) {
          uVar6 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationIndex);
          local_98._M_dataplus._M_p._0_4_ = uVar6;
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    (__return_storage_ptr__,(spirv_cross *)" [[user(clip",(char (*) [13])&local_98,
                     (uint *)")]]",in_R8);
          _Var20._M_p = local_b8._M_dataplus._M_p;
        }
        else {
          if (builtin_00 != BuiltInCullDistance) goto LAB_002b4790;
          uVar6 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationIndex);
          local_98._M_dataplus._M_p._0_4_ = uVar6;
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    (__return_storage_ptr__,(spirv_cross *)" [[user(cull",(char (*) [13])&local_98,
                     (uint *)")]]",in_R8);
          _Var20._M_p = local_b8._M_dataplus._M_p;
        }
      }
      goto LAB_002b406c;
    }
    if ((char)((uint)uVar21 >> 0x18) == '\0') {
LAB_002b4223:
      if (((this->msl_options).raw_buffer_tese_input == true) ||
         (pSVar12 = Compiler::get_type((Compiler *)this,
                                       (TypeID)(type->member_types).
                                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                               .ptr[index].id),
         pSVar12->basetype == ControlPointArray)) goto switchD_002b3a45_caseD_2;
      if ((char)((uint)uVar21 >> 0x18) == '\0') {
        local_50._M_dataplus._M_p._0_4_ =
             get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
      else {
        in_R8 = (char (*) [4])0x0;
        local_50._M_dataplus._M_p._0_4_ =
             get_or_allocate_builtin_input_member_location
                       (this,builtin_00,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
      if ((uint32_t)local_50._M_dataplus._M_p == 0xffffffff) goto LAB_002b46e7;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[attribute(","");
      convert_to_string<unsigned_int,_0>(&local_78,(uint *)&local_50);
      ::std::operator+(&local_b8,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&local_b8,")]]");
    }
    else {
      if (builtin_00 != BuiltInPrimitiveId) {
        if (builtin_00 == BuiltInPatchVertices) goto switchD_002b3a45_caseD_2;
        if (builtin_00 != BuiltInTessCoord) goto LAB_002b4223;
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
      ::std::operator+(&local_b8,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&local_b8,"]]");
    }
LAB_002b3dab:
    paVar18 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    _Var20._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
      _Var20._M_p = local_98._M_dataplus._M_p;
    }
    goto LAB_002b43c4;
  }
  if ((char)((uint)uVar21 >> 0x18) == '\0') {
    member_location_attribute_qualifier_abi_cxx11_(&local_b8,this,type,index);
    if (local_b8._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      goto LAB_002b3b21;
    }
    join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
              (__return_storage_ptr__,(spirv_cross *)" [[",(char (*) [4])&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4077bc,
               (char (*) [3])in_R8);
    pbVar3 = &local_b8;
LAB_002b3afc:
    _Var20._M_p = (pointer)(&(pbVar3->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p == &pbVar3->field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002b43c9;
  }
  switch(builtin_00) {
  case BuiltInPosition:
  case BuiltInLayer:
    goto switchD_002b3a45_caseD_0;
  case BuiltInPointSize:
    bVar5 = (this->msl_options).enable_point_size_builtin;
    if (bVar5 == true) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98," [[","");
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin_00);
      ::std::operator+(&local_b8,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&local_b8,"]]");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if (bVar5 == false) {
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pbVar3 = &local_98;
    goto LAB_002b3afc;
  default:
    goto switchD_002b3a45_caseD_2;
  case BuiltInClipDistance:
    bVar5 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar5) {
      local_b8._M_dataplus._M_p._0_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex)
      ;
      pcVar17 = " [[user(clip";
LAB_002b3f0d:
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)pcVar17,(char (*) [13])&local_b8,
                 (uint *)")]]",in_R8);
      return __return_storage_ptr__;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
    builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
    ::std::operator+(&local_98,&local_78,&local_50);
    puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b8._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    pcVar17 = " ";
    if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar17 = "";
    }
    ::std::operator+(__return_storage_ptr__,&local_b8,pcVar17);
    break;
  case BuiltInCullDistance:
    bVar5 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar5) {
      local_b8._M_dataplus._M_p._0_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex)
      ;
      pcVar17 = " [[user(cull";
      goto LAB_002b3f0d;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
    builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
    ::std::operator+(&local_98,&local_78,&local_50);
    puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b8._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    pcVar17 = " ";
    if ((local_58->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar17 = "";
    }
    ::std::operator+(__return_storage_ptr__,&local_b8,pcVar17);
    break;
  case BuiltInViewportIndex:
    if ((this->msl_options).msl_version < 20000) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"ViewportIndex requires Metal 2.0.");
      goto LAB_002b4e1a;
    }
switchD_002b3a45_caseD_0:
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," [[","");
    builtin_qualifier_abi_cxx11_(&local_50,this,builtin_00);
    uVar13 = local_50._M_string_length +
             CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar19 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < uVar13) {
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        uVar19 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < uVar13) goto LAB_002b3e71;
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_50,0,(char *)0x0,(ulong)local_78._M_dataplus._M_p);
    }
    else {
LAB_002b3e71:
      puVar10 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_78,
                           CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                    (uint32_t)local_50._M_dataplus._M_p));
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_98.field_2._M_allocated_capacity = *puVar14;
      local_98.field_2._8_8_ = puVar10[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar14;
      local_98._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_98._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8.field_2._8_8_ = puVar10[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar14;
      local_b8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_b8._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar11 = (long *)::std::__cxx11::string::append((char *)&local_b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar15 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar15) {
      lVar2 = plVar11[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar11;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
    }
    __return_storage_ptr__->_M_string_length = plVar11[1];
    *plVar11 = (long)psVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
LAB_002b4387:
  paVar18 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  _Var20._M_p = local_78._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint32_t)local_50._M_dataplus._M_p));
    _Var20._M_p = local_78._M_dataplus._M_p;
  }
LAB_002b43c4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var20._M_p != paVar18) {
LAB_002b43c9:
    operator_delete(_Var20._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Vertex and tessellation evaluation function outputs
	if (((execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation) || is_tese_shader()) &&
	    type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR || builtin == BuiltInBaryCoordNoPerspKHR)
		{
			if (has_member_decoration(type.self, index, DecorationFlat) ||
			    has_member_decoration(type.self, index, DecorationCentroid) ||
			    has_member_decoration(type.self, index, DecorationSample) ||
			    has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				// NoPerspective is baked into the builtin type.
				SPIRV_CROSS_THROW(
				    "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs.");
			}
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}